

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

UNumberUnitWidth icu_63::number::impl::stem_to_object::unitWidth(StemEnum stem)

{
  UNumberUnitWidth local_c;
  StemEnum stem_local;
  
  switch(stem) {
  case STEM_UNIT_WIDTH_NARROW:
    local_c = UNUM_UNIT_WIDTH_NARROW;
    break;
  case STEM_UNIT_WIDTH_SHORT:
    local_c = UNUM_UNIT_WIDTH_SHORT;
    break;
  case STEM_UNIT_WIDTH_FULL_NAME:
    local_c = UNUM_UNIT_WIDTH_FULL_NAME;
    break;
  case STEM_UNIT_WIDTH_ISO_CODE:
    local_c = UNUM_UNIT_WIDTH_ISO_CODE;
    break;
  case STEM_UNIT_WIDTH_HIDDEN:
    local_c = UNUM_UNIT_WIDTH_HIDDEN;
    break;
  default:
    local_c = UNUM_UNIT_WIDTH_COUNT;
  }
  return local_c;
}

Assistant:

UNumberUnitWidth stem_to_object::unitWidth(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_UNIT_WIDTH_NARROW:
            return UNUM_UNIT_WIDTH_NARROW;
        case STEM_UNIT_WIDTH_SHORT:
            return UNUM_UNIT_WIDTH_SHORT;
        case STEM_UNIT_WIDTH_FULL_NAME:
            return UNUM_UNIT_WIDTH_FULL_NAME;
        case STEM_UNIT_WIDTH_ISO_CODE:
            return UNUM_UNIT_WIDTH_ISO_CODE;
        case STEM_UNIT_WIDTH_HIDDEN:
            return UNUM_UNIT_WIDTH_HIDDEN;
        default:
            return UNUM_UNIT_WIDTH_COUNT; // for objects, throw; for enums, return COUNT
    }
}